

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall bloaty::RollupOutput::Print(RollupOutput *this,OutputOptions *options,ostream *out)

{
  OutputFormat OVar1;
  size_type sVar2;
  bool csvDiff;
  bool tabs;
  
  if ((this->source_names_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->source_names_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    OVar1 = options->output_format;
    if (OVar1 == kTSV) {
      csvDiff = options->showAllSizesCSV;
      tabs = true;
    }
    else {
      if (OVar1 != kCSV) {
        if (OVar1 != kPrettyPrint) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc"
                        ,0x2bf,
                        "void bloaty::RollupOutput::Print(const OutputOptions &, std::ostream *)");
        }
        PrettyPrint(this,options,out);
        goto LAB_00181480;
      }
      csvDiff = options->showAllSizesCSV;
      tabs = false;
    }
    PrintToCSV(this,out,tabs,csvDiff);
  }
LAB_00181480:
  sVar2 = (this->disassembly_)._M_string_length;
  if (sVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,(this->disassembly_)._M_dataplus._M_p,sVar2);
    return;
  }
  return;
}

Assistant:

void RollupOutput::Print(const OutputOptions& options, std::ostream* out) {
  if (!source_names_.empty()) {
    switch (options.output_format) {
      case bloaty::OutputFormat::kPrettyPrint:
        PrettyPrint(options, out);
        break;
      case bloaty::OutputFormat::kCSV:
        PrintToCSV(out, /*tabs=*/false, options.showAllSizesCSV);
        break;
      case bloaty::OutputFormat::kTSV:
        PrintToCSV(out, /*tabs=*/true, options.showAllSizesCSV);
        break;
      default:
        BLOATY_UNREACHABLE();
    }
  }

  if (!disassembly_.empty()) {
    *out << disassembly_;
  }
}